

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::InstrumentPass::AddParameters
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          InstrumentPass *this,Function *func,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *param_types)

{
  pointer ppTVar1;
  Type *type;
  TypeManager *this_00;
  DefUseManager *this_01;
  pointer *__ptr;
  pointer ppTVar2;
  uint32_t pid;
  Instruction *local_78;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_70;
  uint32_t local_64;
  Op local_60;
  uint32_t local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  IRContext *local_50;
  initializer_list<spvtools::opt::Operand> local_48;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = __return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (__return_storage_ptr__,
             (long)(param_types->
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(param_types->
                   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppTVar1 = (param_types->
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar2 = (param_types->
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppTVar2 != ppTVar1;
      ppTVar2 = ppTVar2 + 1) {
    type = *ppTVar2;
    local_5c = Pass::TakeNextId(&this->super_Pass);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_58,&local_5c);
    local_50 = (this->super_Pass).context_;
    local_60 = OpFunctionParameter;
    this_00 = IRContext::get_type_mgr(local_50);
    local_64 = analysis::TypeManager::GetId(this_00,type);
    local_48._M_array = (iterator)0x0;
    local_48._M_len = 0;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_78,&local_50,&local_60,&local_64,&local_5c,&local_48);
    this_01 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstDefUse(this_01,local_78);
    local_70._M_head_impl = local_78;
    local_78 = (Instruction *)0x0;
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                *)&func->params_,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&local_70);
    if (local_70._M_head_impl != (Instruction *)0x0) {
      (*((local_70._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
    local_70._M_head_impl = (Instruction *)0x0;
    if (local_78 != (Instruction *)0x0) {
      (*(local_78->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
                ();
    }
  }
  return local_58;
}

Assistant:

std::vector<uint32_t> InstrumentPass::AddParameters(
    Function& func, const std::vector<const analysis::Type*>& param_types) {
  std::vector<uint32_t> param_ids;
  param_ids.reserve(param_types.size());
  for (const analysis::Type* param : param_types) {
    uint32_t pid = TakeNextId();
    param_ids.push_back(pid);
    auto param_inst =
        MakeUnique<Instruction>(context(), spv::Op::OpFunctionParameter,
                                context()->get_type_mgr()->GetId(param), pid,
                                std::initializer_list<Operand>{});
    get_def_use_mgr()->AnalyzeInstDefUse(param_inst.get());
    func.AddParameter(std::move(param_inst));
  }
  return param_ids;
}